

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImGuiSettingsHandler * __thiscall
ImVector<ImGuiSettingsHandler>::insert
          (ImVector<ImGuiSettingsHandler> *this,ImGuiSettingsHandler *it,ImGuiSettingsHandler *v)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 uVar3;
  _func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *p_Var4;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *p_Var5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int new_capacity;
  ImGuiSettingsHandler *pIVar11;
  
  pIVar11 = this->Data;
  lVar10 = (long)it - (long)pIVar11;
  iVar9 = this->Size;
  if (iVar9 == this->Capacity) {
    if (iVar9 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar9 / 2 + iVar9;
    }
    new_capacity = iVar9 + 1;
    if (iVar9 + 1 < iVar7) {
      new_capacity = iVar7;
    }
    reserve(this,new_capacity);
    iVar9 = this->Size;
    pIVar11 = this->Data;
  }
  lVar8 = (long)iVar9 - lVar10 / 0x30;
  if (lVar8 != 0 && lVar10 / 0x30 <= (long)iVar9) {
    memmove((void *)((long)pIVar11 + lVar10 + 0x30),(void *)((long)pIVar11 + lVar10),lVar8 * 0x30);
    pIVar11 = this->Data;
  }
  pcVar2 = v->TypeName;
  uVar3 = *(undefined8 *)&v->TypeHash;
  p_Var4 = v->ReadOpenFn;
  p_Var5 = v->ReadLineFn;
  pvVar6 = v->UserData;
  puVar1 = (undefined8 *)((long)pIVar11 + lVar10 + 0x20);
  *puVar1 = v->WriteAllFn;
  puVar1[1] = pvVar6;
  puVar1 = (undefined8 *)((long)pIVar11 + lVar10 + 0x10);
  *puVar1 = p_Var4;
  puVar1[1] = p_Var5;
  *(undefined8 *)((long)pIVar11 + lVar10) = pcVar2;
  ((undefined8 *)((long)pIVar11 + lVar10))[1] = uVar3;
  this->Size = this->Size + 1;
  return (ImGuiSettingsHandler *)(lVar10 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }